

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_NamedArg_Test::TestBody(FormatterTest_NamedArg_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  string gtest_expected_message;
  AssertHelper *local_898;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_890;
  AssertionResult *local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_878;
  undefined4 *local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  undefined4 local_838;
  char **local_828;
  internal local_820 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined4 local_7f0;
  undefined4 *local_7e0;
  AssertionResult local_7d8;
  AssertHelper *local_7c8;
  undefined4 local_7b8;
  char *local_7a8;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  char *local_760;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_758;
  undefined8 local_750;
  undefined4 local_740;
  undefined4 *local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_700;
  long local_6f8;
  undefined8 local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8 [2];
  undefined4 local_6d8;
  AssertHelper **local_6c8;
  undefined4 local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a8;
  undefined4 local_698;
  char **local_688;
  undefined4 local_678;
  char **local_668;
  undefined4 local_658;
  char **local_648;
  undefined4 local_638;
  char **local_628;
  undefined4 local_618;
  char **local_608;
  undefined4 local_5f8;
  char **local_5e8;
  undefined4 local_5d8;
  char **local_5c8;
  undefined4 local_5b8;
  char **local_5a8;
  undefined4 local_598;
  char **local_588;
  undefined4 local_578;
  char **local_568;
  undefined4 local_558;
  char **local_548;
  undefined4 local_538;
  char **local_528;
  undefined4 local_518;
  undefined4 local_508;
  undefined4 local_4f8;
  char *local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c0;
  undefined4 *local_4b0;
  char *local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined4 local_488;
  undefined4 *local_478;
  AssertHelper local_470;
  int *local_468;
  AssertHelperData local_460 [9];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined4 local_238 [4];
  char *local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined4 local_208;
  undefined4 *local_1f8;
  char *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d0;
  undefined4 *local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined4 local_198;
  undefined4 *local_188;
  char *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 local_160;
  undefined4 *local_150;
  char *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined4 local_128;
  undefined4 *local_118;
  char *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f0;
  undefined4 *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 local_b8;
  undefined4 *local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_80;
  undefined4 *local_70;
  char *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 *local_38;
  
  local_460[0].message._M_string_length = (size_type)&local_4e0;
  local_4e0 = (char *)CONCAT71(local_4e0._1_7_,0x61);
  local_470.data_ = (AssertHelperData *)0x237339;
  local_468 = (int *)0x2;
  local_888 = &local_7d8;
  local_7d8._0_8_ = "A_";
  local_7d8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2
  ;
  local_7a8 = "A";
  local_828 = &local_4a8;
  local_4a8 = (char *)CONCAT44(local_4a8._4_4_,1);
  local_878 = &local_858;
  local_858._M_dataplus._M_p = "_1";
  local_858._M_string_length = 2;
  local_460[0].type = 0x61;
  local_460[0]._4_4_ = 0;
  local_460[0].line = 7;
  local_7c8 = (AssertHelper *)0x240d02;
  local_7b8 = 10;
  local_858.field_2._M_allocated_capacity = 1;
  local_838 = 2;
  local_6f8 = 0;
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  local_6f0 = 500;
  format_str.size_ = 0xe;
  format_str.data_ = "{_1}/{a_}/{A_}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_898;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::named_arg<char,char>,fmt::v5::internal::named_arg<char[2],char>,fmt::v5::internal::named_arg<int,char>>
                ::TYPES;
  local_898 = &local_470;
  local_700 = local_6e8;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_708,format_str,args,(locale_ref)0x0);
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_810,local_700,local_6f8 + (long)local_700);
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  if (local_700 != local_6e8) {
    operator_delete(local_700);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_760,"\"1/a/A\"",
             "format(\"{_1}/{a_}/{A_}\", fmt::arg(\"a_\", \'a\'), fmt::arg(\"A_\", \"A\"), fmt::arg(\"_1\", 1))"
             ,(char (*) [6])"1/a/A",&local_810);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if (local_760._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_708);
    if (local_758.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_758.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x336,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    if (((local_708.values_ !=
          (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_708.values_ !=
        (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         *)0x0)) {
      (**(code **)(((local_708.values_)->field_0).string.value + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_758,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_7d8.success_ == true) {
    local_470.data_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"argument not found","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_238[0] = 0;
      local_6f8 = 0;
      local_708.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&PTR_grow_002a3c18;
      local_6f0 = 500;
      format_str_00.size_ = 3;
      format_str_00.data_ = "{a}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_238;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_700 = local_6e8;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_708,format_str_00,args_00,(locale_ref)0x0);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,local_700,local_6f8 + (long)local_700);
      local_708.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&PTR_grow_002a3c18;
      if (local_700 != local_6e8) {
        operator_delete(local_700);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_7d8,
               (char (*) [95])
               "Expected: format(\"{a}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_470.data_ != local_460) {
      operator_delete(local_470.data_);
    }
  }
  testing::Message::Message((Message *)&local_708);
  if (local_7d8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_7d8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_470,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x337,pcVar3);
  testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_708);
  testing::internal::AssertHelper::~AssertHelper(&local_470);
  if (((local_708.values_ !=
        (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_708.values_ !=
      (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       *)0x0)) {
    (**(code **)(((local_708.values_)->field_0).string.value + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_810._M_dataplus._M_p._0_4_ = 4;
  local_470.data_ = (AssertHelperData *)0x23befa;
  local_468 = (int *)0x5;
  local_460[0].message._M_string_length = (size_type)&local_810;
  local_7d8.success_ = true;
  local_7d8._1_7_ = 0xffffff;
  local_460[0].type = 4;
  local_460[0]._4_4_ = 0;
  local_460[0].line = 2;
  local_6f8 = 0;
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  local_6f0 = 500;
  format_str_01.size_ = 0xb;
  format_str_01.data_ = "{0:{width}}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7d8;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,fmt::v5::internal::named_arg<int,char>>
       ::TYPES;
  local_7c8 = &local_470;
  local_700 = local_6e8;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_708,format_str_01,args_01,(locale_ref)0x0);
  paVar1 = &local_858.field_2;
  local_858._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,local_700,local_6f8 + (long)local_700);
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  if (local_700 != local_6e8) {
    operator_delete(local_700);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_898,"\" -42\"",
             "format(\"{0:{width}}\", -42, fmt::arg(\"width\", 4))",(char (*) [5])0x23b7d1,
             &local_858);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != paVar1) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_708);
    if (local_890.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_890.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x338,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    if (((local_708.values_ !=
          (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_708.values_ !=
        (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         *)0x0)) {
      (**(code **)(((local_708.values_)->field_0).string.value + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_810._M_dataplus._M_p._0_4_ = 2;
  local_470.data_ = (AssertHelperData *)0x23e54f;
  local_468 = (int *)0x9;
  local_460[0].message._M_string_length = (size_type)&local_810;
  local_7d8._0_8_ = "str";
  local_460[0].type = kFatalFailure;
  local_460[0]._4_4_ = 0;
  local_460[0].line = 2;
  local_6f8 = 0;
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  local_6f0 = 500;
  format_str_02.size_ = 0x10;
  format_str_02.data_ = "{0:.{precision}}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7d8;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4],fmt::v5::internal::named_arg<int,char>>
       ::TYPES;
  local_7c8 = &local_470;
  local_700 = local_6e8;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_708,format_str_02,args_02,(locale_ref)0x0);
  local_858._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,local_700,local_6f8 + (long)local_700);
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  if (local_700 != local_6e8) {
    operator_delete(local_700);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_898,"\"st\"",
             "format(\"{0:.{precision}}\", \"str\", fmt::arg(\"precision\", 2))",
             (char (*) [3])0x235a02,&local_858);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != paVar1) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_708);
    if (local_890.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_890.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x339,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    if (((local_708.values_ !=
          (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_708.values_ !=
        (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         *)0x0)) {
      (**(code **)(((local_708.values_)->field_0).string.value + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_810._M_dataplus._M_p._0_4_ = 2;
  local_470.data_ = (AssertHelperData *)0x24231f;
  local_468 = (int *)0x3;
  local_460[0].message._M_string_length = (size_type)&local_810;
  local_7d8.success_ = true;
  local_7d8._1_7_ = 0;
  local_460[0].type = kFatalFailure;
  local_460[0]._4_4_ = 0;
  local_460[0].line = 2;
  local_6f8 = 0;
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  local_6f0 = 500;
  format_str_03.size_ = 8;
  format_str_03.data_ = "{} {two}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7d8;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,fmt::v5::internal::named_arg<int,char>>
       ::TYPES;
  local_7c8 = &local_470;
  local_700 = local_6e8;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_708,format_str_03,args_03,(locale_ref)0x0);
  local_858._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,local_700,local_6f8 + (long)local_700);
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&PTR_grow_002a3c18;
  if (local_700 != local_6e8) {
    operator_delete(local_700);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_898,"\"1 2\"","format(\"{} {two}\", 1, fmt::arg(\"two\", 2))",
             (char (*) [4])"1 2",&local_858);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != paVar1) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if (local_898._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_708);
    if (local_890.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_890.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x33a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    if (((local_708.values_ !=
          (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_708.values_ !=
        (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         *)0x0)) {
      (**(code **)(((local_708.values_)->field_0).string.value + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_890,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7a8 = (char *)&local_764;
  local_764 = 0;
  local_7d8._0_8_ = "a";
  local_7d8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1
  ;
  local_828 = (char **)&local_768;
  local_768 = 0;
  local_858._M_dataplus._M_p = "b";
  local_858._M_string_length = 1;
  local_868 = &local_76c;
  local_76c = 0x2a;
  local_898 = (AssertHelper *)0x238055;
  local_890.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_7e0 = &local_770;
  local_770 = 0;
  local_810._M_dataplus._M_p = "d";
  local_810._M_string_length = 1;
  local_730 = &local_774;
  local_774 = 0;
  local_760 = "e";
  local_758.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_478 = &local_778;
  local_778 = 0;
  local_4a8 = "f";
  local_4a0 = 1;
  local_4b0 = &local_77c;
  local_77c = 0;
  local_4e0 = "g";
  local_4d8 = 1;
  local_38 = &local_780;
  local_780 = 0;
  local_628 = &local_68;
  local_68 = "h";
  local_60 = 1;
  local_70 = &local_784;
  local_784 = 0;
  local_608 = &local_a0;
  local_a0 = "i";
  local_98 = 1;
  local_a8 = &local_788;
  local_788 = 0;
  local_5e8 = &local_d8;
  local_d8 = "j";
  local_d0 = 1;
  local_e0 = &local_78c;
  local_78c = 0;
  local_5c8 = &local_110;
  local_110 = "k";
  local_108 = 1;
  local_5a8 = &local_148;
  local_148 = "l";
  local_118 = &local_790;
  local_790 = 0;
  local_140 = 1;
  local_588 = &local_180;
  local_180 = "m";
  local_150 = &local_794;
  local_794 = 0;
  local_178 = 1;
  local_568 = &local_1b8;
  local_1b8 = "n";
  local_188 = &local_798;
  local_798 = 0;
  local_1b0 = 1;
  local_548 = &local_1f0;
  local_1f0 = "o";
  local_1c0 = &local_79c;
  local_79c = 0;
  local_1e8 = 1;
  local_528 = &local_228;
  local_228 = "p";
  local_220 = 1;
  local_1f8 = &local_7a0;
  local_7a0 = 0;
  local_6f8 = CONCAT44(local_6f8._4_4_,1);
  local_6d8 = 1;
  local_6b8 = 1;
  local_6c8 = &local_898;
  local_698 = 1;
  local_6a8 = &local_810;
  local_678 = 1;
  local_688 = &local_760;
  local_658 = 1;
  local_668 = &local_4a8;
  local_638 = 1;
  local_648 = &local_4e0;
  local_618 = 1;
  local_58 = 0;
  local_48 = 2;
  local_5f8 = 1;
  local_90 = 0;
  local_80 = 2;
  local_5d8 = 1;
  local_c8 = 0;
  local_b8 = 2;
  local_5b8 = 1;
  local_100 = 0;
  local_f0 = 2;
  local_598 = 1;
  local_138 = 0;
  local_128 = 2;
  local_578 = 1;
  local_170 = 0;
  local_160 = 2;
  local_558 = 1;
  local_1a8 = 0;
  local_198 = 2;
  local_538 = 1;
  local_1e0 = 0;
  local_1d0 = 2;
  local_518 = 1;
  local_7c8 = (AssertHelper *)0x0;
  local_7b8 = 2;
  local_858.field_2._M_allocated_capacity = 0;
  local_838 = 2;
  local_888 = (AssertionResult *)0x2a;
  local_878 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_878._4_4_,2);
  local_810.field_2._M_allocated_capacity = 0;
  local_7f0 = 2;
  local_750 = 0;
  local_740 = 2;
  local_498 = 0;
  local_488 = 2;
  local_4d0 = 0;
  local_4c0 = 2;
  local_218 = 0;
  local_208 = 2;
  local_508 = 0;
  local_4f8 = 0;
  local_460[0]._0_8_ = 0;
  local_470.data_ = (AssertHelperData *)&PTR_grow_002a3c18;
  local_460[0].file = (char *)0x1f4;
  format_str_04.size_ = 3;
  format_str_04.data_ = "{c}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_708;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>>
       ::TYPES;
  local_708.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_7d8;
  local_6e8[0] = &local_858;
  local_468 = &local_460[0].line;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_470,format_str_04,args_04,(locale_ref)0x0);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_728,local_468,(undefined1 *)(local_460[0]._0_8_ + (long)local_468));
  local_470.data_ = (AssertHelperData *)&PTR_grow_002a3c18;
  if (local_468 != &local_460[0].line) {
    operator_delete(local_468);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_820,"\"42\"",
             "format(\"{c}\", fmt::arg(\"a\", 0), fmt::arg(\"b\", 0), fmt::arg(\"c\", 42), fmt::arg(\"d\", 0), fmt::arg(\"e\", 0), fmt::arg(\"f\", 0), fmt::arg(\"g\", 0), fmt::arg(\"h\", 0), fmt::arg(\"i\", 0), fmt::arg(\"j\", 0), fmt::arg(\"k\", 0), fmt::arg(\"l\", 0), fmt::arg(\"m\", 0), fmt::arg(\"n\", 0), fmt::arg(\"o\", 0), fmt::arg(\"p\", 0))"
             ,(char (*) [3])0x242e5f,&local_728);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p);
  }
  if (local_820[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_708);
    if (local_818.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_818.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x33f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,(Message *)&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    if ((((AssertionResult *)local_708.values_ != (AssertionResult *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((AssertionResult *)local_708.values_ != (AssertionResult *)0x0)) {
      (**(code **)(((local_708.values_)->field_0).long_long_value + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_818,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, NamedArg) {
  EXPECT_EQ("1/a/A", format("{_1}/{a_}/{A_}", fmt::arg("a_", 'a'),
                            fmt::arg("A_", "A"), fmt::arg("_1", 1)));
  EXPECT_THROW_MSG(format("{a}"), format_error, "argument not found");
  EXPECT_EQ(" -42", format("{0:{width}}", -42, fmt::arg("width", 4)));
  EXPECT_EQ("st", format("{0:.{precision}}", "str", fmt::arg("precision", 2)));
  EXPECT_EQ("1 2", format("{} {two}", 1, fmt::arg("two", 2)));
  EXPECT_EQ("42", format("{c}",
        fmt::arg("a", 0), fmt::arg("b", 0), fmt::arg("c", 42), fmt::arg("d", 0),
        fmt::arg("e", 0), fmt::arg("f", 0), fmt::arg("g", 0), fmt::arg("h", 0),
        fmt::arg("i", 0), fmt::arg("j", 0), fmt::arg("k", 0), fmt::arg("l", 0),
        fmt::arg("m", 0), fmt::arg("n", 0), fmt::arg("o", 0), fmt::arg("p", 0)));
}